

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq_test.c
# Opt level: O3

void test_xreq_ttl_option(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  int local_3c;
  _Bool local_35;
  int v;
  _Bool b;
  nng_socket rep;
  
  nVar1 = nng_req0_open_raw((nng_socket *)&v);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x160,"%s: expected success, got %s (%d)","nng_req0_open_raw(&rep)",pcVar3
                         ,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_socket_set_int((nng_socket)v,"ttl-max",1);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                           ,0x162,"%s: expected success, got %s (%d)",
                           "nng_socket_set_int(rep, opt, 1)",pcVar3,nVar1);
    if (iVar2 != 0) {
      num = nng_socket_set_int((nng_socket)v,"ttl-max",0);
      pcVar3 = nng_strerror(NNG_EINVAL);
      acutest_check_((uint)(num == NNG_EINVAL),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                     ,0x163,"%s fails with %s","nng_socket_set_int(rep, opt, 0)",pcVar3,nVar1);
      pcVar3 = nng_strerror(NNG_EINVAL);
      pcVar4 = nng_strerror(num);
      acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(rep, opt, 0)",pcVar3,
                       3,pcVar4,(ulong)num);
      nVar1 = nng_socket_set_int((nng_socket)v,"ttl-max",-1);
      pcVar3 = nng_strerror(NNG_EINVAL);
      acutest_check_((uint)(nVar1 == NNG_EINVAL),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                     ,0x164,"%s fails with %s","nng_socket_set_int(rep, opt, -1)",pcVar3);
      pcVar3 = nng_strerror(NNG_EINVAL);
      pcVar4 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(rep, opt, -1)",pcVar3
                       ,3,pcVar4,(ulong)nVar1);
      nVar1 = nng_socket_set_int((nng_socket)v,"ttl-max",0x10);
      pcVar3 = nng_strerror(NNG_EINVAL);
      acutest_check_((uint)(nVar1 == NNG_EINVAL),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                     ,0x165,"%s fails with %s","nng_socket_set_int(rep, opt, 16)",pcVar3);
      pcVar3 = nng_strerror(NNG_EINVAL);
      pcVar4 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(rep, opt, 16)",pcVar3
                       ,3,pcVar4,(ulong)nVar1);
      nVar1 = nng_socket_set_int((nng_socket)v,"ttl-max",0x100);
      pcVar3 = nng_strerror(NNG_EINVAL);
      acutest_check_((uint)(nVar1 == NNG_EINVAL),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                     ,0x166,"%s fails with %s","nng_socket_set_int(rep, opt, 256)",pcVar3);
      pcVar3 = nng_strerror(NNG_EINVAL);
      pcVar4 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(rep, opt, 256)",
                       pcVar3,3,pcVar4,(ulong)nVar1);
      nVar1 = nng_socket_set_int((nng_socket)v,"ttl-max",3);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                             ,0x167,"%s: expected success, got %s (%d)",
                             "nng_socket_set_int(rep, opt, 3)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_get_int((nng_socket)v,"ttl-max",&local_3c);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                               ,0x168,"%s: expected success, got %s (%d)",
                               "nng_socket_get_int(rep, opt, &v)",pcVar3,nVar1);
        if (iVar2 != 0) {
          acutest_check_((uint)(local_3c == 3),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x169,"%s","v == 3");
          iVar2 = nng_socket_set_bool((nng_socket)v,"ttl-max",true);
          acutest_check_((uint)(iVar2 == 0x1e),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x16b,"%s","nng_socket_set_bool(rep, opt, true) == NNG_EBADTYPE");
          iVar2 = nng_socket_get_bool((nng_socket)v,"ttl-max",&local_35);
          acutest_check_((uint)(iVar2 == 0x1e),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x16c,"%s","nng_socket_get_bool(rep, opt, &b) == NNG_EBADTYPE");
          nVar1 = nng_socket_close((nng_socket)v);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                 ,0x16e,"%s: expected success, got %s (%d)","nng_socket_close(rep)",
                                 pcVar3,nVar1);
          if (iVar2 != 0) {
            return;
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_xreq_ttl_option(void)
{
	nng_socket  rep;
	int         v;
	bool        b;
	const char *opt = NNG_OPT_MAXTTL;

	NUTS_PASS(nng_req0_open_raw(&rep));

	NUTS_PASS(nng_socket_set_int(rep, opt, 1));
	NUTS_FAIL(nng_socket_set_int(rep, opt, 0), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(rep, opt, -1), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(rep, opt, 16), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(rep, opt, 256), NNG_EINVAL);
	NUTS_PASS(nng_socket_set_int(rep, opt, 3));
	NUTS_PASS(nng_socket_get_int(rep, opt, &v));
	NUTS_TRUE(v == 3);

	NUTS_TRUE(nng_socket_set_bool(rep, opt, true) == NNG_EBADTYPE);
	NUTS_TRUE(nng_socket_get_bool(rep, opt, &b) == NNG_EBADTYPE);

	NUTS_CLOSE(rep);
}